

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::PlainTemplatedDefines<long,duckdb::TemplatedParquetValueConversion<int>,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  int iVar1;
  data_ptr_t pdVar2;
  int *piVar3;
  uint64_t uVar4;
  
  if (plain_data->len < num_values * 4) {
    PlainTemplatedInternal<long,duckdb::TemplatedParquetValueConversion<int>,false,true>
              (this,plain_data,defines,num_values,result_offset,result);
    return;
  }
  pdVar2 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (result_offset < result_offset + num_values) {
    uVar4 = 0;
    piVar3 = (int *)plain_data->ptr;
    do {
      iVar1 = *piVar3;
      plain_data->len = plain_data->len - 4;
      plain_data->ptr = (data_ptr_t)(piVar3 + 1);
      *(long *)(pdVar2 + uVar4 * 8 + result_offset * 8) = (long)iVar1;
      uVar4 = uVar4 + 1;
      piVar3 = piVar3 + 1;
    } while (num_values != uVar4);
  }
  return;
}

Assistant:

void PlainTemplatedDefines(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, idx_t result_offset,
	                           Vector &result) {
		if (CONVERSION::PlainAvailable(plain_data, num_values)) {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, false>(plain_data, defines, num_values,
			                                                                   result_offset, result);
		} else {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, true>(plain_data, defines, num_values,
			                                                                  result_offset, result);
		}
	}